

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O3

void duckdb_je_sc_data_init(sc_data_t *sc_data)

{
  _Bool _Var1;
  int index;
  size_t sVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  sc_t *psVar8;
  int lg_base;
  undefined8 in_R9;
  int iVar9;
  size_t sVar10;
  int iVar11;
  size_t sVar12;
  ulong uVar13;
  int lg_ngroup;
  int iVar14;
  int in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  long lVar15;
  
  sc_data->sc[0].index = 0;
  sc_data->sc[0].lg_base = 3;
  sc_data->sc[0].lg_delta = 3;
  sc_data->sc[0].ndelta = 0;
  sc_data->sc[0].psz = false;
  sc_data->sc[0].bin = true;
  sc_data->sc[0].pgs = 1;
  sc_data->sc[0].lg_delta_lookup = 3;
  sc_data->sc[1].index = 1;
  sc_data->sc[1].lg_base = 3;
  sc_data->sc[1].lg_delta = 3;
  sc_data->sc[1].ndelta = 1;
  sc_data->sc[1].psz = false;
  sc_data->sc[1].bin = true;
  sc_data->sc[1].pgs = 1;
  sc_data->sc[1].lg_delta_lookup = 3;
  psVar8 = sc_data->sc + 2;
  uVar7 = 0;
  iVar11 = 2;
  lVar6 = -3;
  do {
    size_class(psVar8,(int)lVar6 + 5,4,4,(int)lVar6 + 4,(int)in_R9,in_stack_ffffffffffffff68,
               (int)in_stack_ffffffffffffff70);
    uVar7 = uVar7 + psVar8->psz;
    iVar11 = iVar11 + (uint)psVar8->bin;
    psVar8 = psVar8 + 1;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0);
  lg_base = 0;
  lVar5 = 5;
  iVar9 = 1;
  lg_ngroup = 4;
  sVar10 = 0;
  sVar12 = 0;
  lVar6 = 6;
  do {
    uVar13 = 1;
    lVar15 = lVar6 + 1;
    iVar14 = (int)lVar5;
    lVar4 = (lVar5 << 0x20) + -0x100000000;
    psVar8 = sc_data->sc + iVar14;
    do {
      index = (int)uVar13;
      size_class(psVar8,iVar14 + -1 + index,(int)lVar6,lg_ngroup,index,lg_base,
                 in_stack_ffffffffffffff68,(int)lVar15);
      sVar2 = (uVar13 << ((byte)lg_ngroup & 0x3f)) + (1L << ((byte)lVar6 & 0x3f));
      if (psVar8->lg_delta_lookup != 0) {
        iVar9 = iVar14 + index;
        sVar12 = sVar2;
      }
      uVar7 = uVar7 + psVar8->psz;
      _Var1 = psVar8->bin;
      if (_Var1 != false) {
        sVar10 = sVar2;
      }
      if (_Var1 != false) {
        lg_base = (int)lVar15;
      }
      iVar11 = iVar11 + (uint)_Var1;
      uVar13 = uVar13 + 1;
      lVar4 = lVar4 + 0x100000000;
      psVar8 = psVar8 + 1;
    } while (((ulong)(lVar6 == 0x3e) ^ 5) != uVar13);
    lg_ngroup = lg_ngroup + 1;
    lVar5 = (long)iVar14 + uVar13 + -1;
    lVar6 = lVar15;
  } while (lVar15 != 0x3f);
  uVar13 = lVar4 >> 0x20;
  if (uVar13 == 0) {
    uVar3 = 0x40;
  }
  else {
    lVar6 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    uVar3 = (uint)lVar6 ^ 0x3f;
  }
  sc_data->ntiny = 1;
  sc_data->nlbins = iVar9;
  sc_data->nbins = iVar11;
  sc_data->nsizes = iVar14 + 3;
  sc_data->lg_ceil_nsizes = 0x40 - uVar3;
  sc_data->npsizes = uVar7;
  sc_data->lg_tiny_maxclass = 3;
  sc_data->lookup_maxclass = sVar12;
  sc_data->small_maxclass = sVar10;
  sc_data->lg_large_minclass = lg_base;
  sc_data->large_minclass = 1L << ((byte)lg_base & 0x3f);
  sc_data->large_maxclass = sVar2;
  sc_data->initialized = true;
  return;
}

Assistant:

void
sc_data_init(sc_data_t *sc_data) {
	size_classes(sc_data, LG_SIZEOF_PTR, LG_QUANTUM, SC_LG_TINY_MIN,
	    SC_LG_MAX_LOOKUP, LG_PAGE, SC_LG_NGROUP);

	sc_data->initialized = true;
}